

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

void __thiscall Lexer::EatWhitespace(Lexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)this->ofs_;
  while( true ) {
    while( true ) {
      this->ofs_ = (char *)pbVar2;
      if (-1 < (char)""[*pbVar2]) break;
      do {
        pbVar1 = pbVar2 + 1;
        pbVar2 = pbVar2 + 1;
      } while ((char)""[*pbVar1] < '\0');
    }
    if (*pbVar2 != 0x24) break;
    if (pbVar2[1] == 0xd) {
      pbVar1 = pbVar2 + 2;
      pbVar2 = pbVar2 + 3;
      if (*pbVar1 != 10) {
        return;
      }
    }
    else {
      if (pbVar2[1] != 10) {
        return;
      }
      pbVar2 = pbVar2 + 2;
    }
  }
  return;
}

Assistant:

void Lexer::EatWhitespace() {
  const char* p = ofs_;
  const char* q;
  for (;;) {
    ofs_ = p;
    
{
	unsigned char yych;
	static const unsigned char yybm[] = {
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		128,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
	};
	yych = *p;
	if (yybm[0+yych] & 128) {
		goto yy81;
	}
	if (yych <= 0x00) goto yy77;
	if (yych == '$') goto yy84;
	goto yy79;
yy77:
	++p;
	{ break; }
yy79:
	++p;
yy80:
	{ break; }
yy81:
	yych = *++p;
	if (yybm[0+yych] & 128) {
		goto yy81;
	}
	{ continue; }
yy84:
	yych = *(q = ++p);
	if (yych == '\n') goto yy85;
	if (yych == '\r') goto yy87;
	goto yy80;
yy85:
	++p;
	{ continue; }
yy87:
	yych = *++p;
	if (yych == '\n') goto yy89;
	p = q;
	goto yy80;
yy89:
	++p;
	{ continue; }
}

  }
}